

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O0

void __thiscall
slang::ast::RandSeqProductionSymbol::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
          (RandSeqProductionSymbol *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  reference ppPVar2;
  reference ppEVar3;
  Expression *expr;
  iterator __end7;
  iterator __begin7;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range7;
  CaseItem *item;
  iterator __end6;
  iterator __begin6;
  span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *__range6;
  CaseProd *cp;
  RepeatProd *rp;
  IfElseProd *iep;
  ProdBase *prod;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL> *__range4
  ;
  Rule *rule;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *__range3;
  RandSeqProductionSymbol *in_stack_00000318;
  AlwaysFFVisitor *in_stack_ffffffffffffff38;
  Expression *in_stack_ffffffffffffff40;
  Expression *in_stack_ffffffffffffff48;
  iterator in_stack_ffffffffffffff58;
  reference in_stack_ffffffffffffff60;
  __normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
  local_88;
  ProdBase *local_80;
  ProdBase *local_78;
  ProdBase *local_70;
  ProdBase *local_68;
  ProdBase *local_60;
  ProdBase **local_58;
  __normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
  local_50;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL> *local_48
  ;
  reference local_40;
  Rule *local_38;
  __normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> local_28;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *local_18;
  
  local_28 = getRules(in_stack_00000318);
  local_18 = &local_28;
  local_30._M_current =
       (Rule *)std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>::
               begin((span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>
                      *)in_stack_ffffffffffffff38);
  local_38 = (Rule *)std::
                     span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>::
                     end((span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>
                          *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
               ::operator*(&local_30);
    local_48 = &local_40->prods;
    local_50._M_current =
         (ProdBase **)
         std::
         span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>::
         begin((span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
                *)in_stack_ffffffffffffff38);
    local_58 = (ProdBase **)
               std::
               span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
               ::end((span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
                      *)in_stack_ffffffffffffff48);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppPVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                ::operator*(&local_50);
      local_60 = *ppPVar2;
      in_stack_ffffffffffffff40 = (Expression *)(ulong)local_60->kind;
      switch(in_stack_ffffffffffffff40) {
      case (Expression *)0x0:
        ProdItem::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                  ((ProdItem *)in_stack_ffffffffffffff60,
                   (AlwaysFFVisitor *)in_stack_ffffffffffffff58._M_current);
        break;
      case (Expression *)0x1:
        break;
      case (Expression *)0x2:
        local_68 = local_60;
        not_null<const_slang::ast::Expression_*>::operator->
                  ((not_null<const_slang::ast::Expression_*> *)0x1f3306);
        Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ProdItem::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                  ((ProdItem *)in_stack_ffffffffffffff60,
                   (AlwaysFFVisitor *)in_stack_ffffffffffffff58._M_current);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x1f333a);
        if (bVar1) {
          std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator->
                    ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x1f334e);
          ProdItem::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                    ((ProdItem *)in_stack_ffffffffffffff60,
                     (AlwaysFFVisitor *)in_stack_ffffffffffffff58._M_current);
        }
        break;
      case (Expression *)0x3:
        local_70 = local_60;
        not_null<const_slang::ast::Expression_*>::operator->
                  ((not_null<const_slang::ast::Expression_*> *)0x1f337b);
        Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ProdItem::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                  ((ProdItem *)in_stack_ffffffffffffff60,
                   (AlwaysFFVisitor *)in_stack_ffffffffffffff58._M_current);
        break;
      case (Expression *)0x4:
        local_78 = local_60;
        not_null<const_slang::ast::Expression_*>::operator->
                  ((not_null<const_slang::ast::Expression_*> *)0x1f33be);
        Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x1f33dc);
        if (bVar1) {
          std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator->
                    ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x1f33f0);
          ProdItem::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                    ((ProdItem *)in_stack_ffffffffffffff60,
                     (AlwaysFFVisitor *)in_stack_ffffffffffffff58._M_current);
        }
        local_80 = local_78 + 4;
        local_88._M_current =
             (CaseItem *)
             std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
             ::begin((span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
                      *)in_stack_ffffffffffffff38);
        std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>::end
                  ((span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
                    *)in_stack_ffffffffffffff48);
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff40,
                                  (__normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
          in_stack_ffffffffffffff60 =
               __gnu_cxx::
               __normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
               ::operator*(&local_88);
          in_stack_ffffffffffffff58 =
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          in_stack_ffffffffffffff38);
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     in_stack_ffffffffffffff48);
          while (bVar1 = __gnu_cxx::
                         operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)in_stack_ffffffffffffff40,
                                    (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
            ppEVar3 = __gnu_cxx::
                      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   *)&stack0xffffffffffffff58);
            in_stack_ffffffffffffff48 = *ppEVar3;
            Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            __gnu_cxx::
            __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
            ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)&stack0xffffffffffffff58);
          }
          ProdItem::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
                    ((ProdItem *)in_stack_ffffffffffffff60,
                     (AlwaysFFVisitor *)in_stack_ffffffffffffff58._M_current);
          __gnu_cxx::
          __normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
          ::operator++(&local_88);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
      ::operator++(&local_50);
    }
    if (local_40->weightExpr != (Expression *)0x0) {
      Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (local_40->randJoinExpr != (Expression *)0x0) {
      Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& rule : getRules()) {
            for (auto prod : rule.prods) {
                switch (prod->kind) {
                    case ProdKind::Item:
                        ((const ProdItem*)prod)->visitExprs(visitor);
                        break;
                    case ProdKind::CodeBlock:
                        break;
                    case ProdKind::IfElse: {
                        auto& iep = *(const IfElseProd*)prod;
                        iep.expr->visit(visitor);
                        iep.ifItem.visitExprs(visitor);
                        if (iep.elseItem)
                            iep.elseItem->visitExprs(visitor);
                        break;
                    }
                    case ProdKind::Repeat: {
                        auto& rp = *(const RepeatProd*)prod;
                        rp.expr->visit(visitor);
                        rp.item.visitExprs(visitor);
                        break;
                    }
                    case ProdKind::Case: {
                        auto& cp = *(const CaseProd*)prod;
                        cp.expr->visit(visitor);
                        if (cp.defaultItem)
                            cp.defaultItem->visitExprs(visitor);

                        for (auto& item : cp.items) {
                            for (auto expr : item.expressions)
                                expr->visit(visitor);

                            item.item.visitExprs(visitor);
                        }
                        break;
                    }
                }
            }

            if (rule.weightExpr)
                rule.weightExpr->visit(visitor);

            if (rule.randJoinExpr)
                rule.randJoinExpr->visit(visitor);
        }
    }